

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::CommitDataRequest::Serialize(CommitDataRequest *this,Message *msg)

{
  bool bVar1;
  reference this_00;
  reference this_01;
  Message *pMVar2;
  void *data;
  size_t size;
  CommitDataRequest_ChunkToPatch *it_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch>_>
  *__range2_1;
  CommitDataRequest_ChunksToMove *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
  *__range2;
  Message *msg_local;
  CommitDataRequest *this_local;
  
  __end2 = std::
           vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
           ::begin(&this->chunks_to_move_);
  it = (CommitDataRequest_ChunksToMove *)
       std::
       vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
       ::end(&this->chunks_to_move_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunksToMove_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>_>
                                     *)&it), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunksToMove_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>_>
              ::operator*(&__end2);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,1);
    CommitDataRequest_ChunksToMove::Serialize(this_00,pMVar2);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunksToMove_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch>_>
             ::begin(&this->chunks_to_patch_);
  it_1 = (CommitDataRequest_ChunkToPatch *)
         std::
         vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch>_>
         ::end(&this->chunks_to_patch_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunkToPatch_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch>_>_>
                             *)&it_1), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunkToPatch_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch>_>_>
              ::operator*(&__end2_1);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,2);
    CommitDataRequest_ChunkToPatch::Serialize(this_01,pMVar2);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::CommitDataRequest_ChunkToPatch_*,_std::vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch>_>_>
    ::operator++(&__end2_1);
  }
  bVar1 = std::bitset<4UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,3,this->flush_request_id_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void CommitDataRequest::Serialize(::protozero::Message* msg) const {
  // Field 1: chunks_to_move
  for (auto& it : chunks_to_move_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: chunks_to_patch
  for (auto& it : chunks_to_patch_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  // Field 3: flush_request_id
  if (_has_field_[3]) {
    msg->AppendVarInt(3, flush_request_id_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}